

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

void init_arrays(void)

{
  errr eVar1;
  char *pcVar2;
  char *msg;
  uint i;
  
  for (msg._4_4_ = 0; msg._4_4_ < 0x29; msg._4_4_ = msg._4_4_ + 1) {
    pcVar2 = format("Initializing %s...");
    pcVar2 = string_make(pcVar2);
    event_signal_message(EVENT_INITSTATUS,L'\0',pcVar2);
    string_free(pcVar2);
    eVar1 = run_parser(pl[msg._4_4_].parser);
    if (eVar1 != 0) {
      quit_fmt("Cannot initialize %s.",pl[msg._4_4_].name);
    }
  }
  return;
}

Assistant:

void init_arrays(void)
{
	unsigned int i;

	for (i = 0; i < N_ELEMENTS(pl); i++) {
		char *msg = string_make(format("Initializing %s...", pl[i].name));
		event_signal_message(EVENT_INITSTATUS, 0, msg);
		string_free(msg);
		if (run_parser(pl[i].parser))
			quit_fmt("Cannot initialize %s.", pl[i].name);
	}
}